

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeInternalForces
          (ChElementTetraCorot_4 *this,ChVectorDynamic<> *Fi)

{
  ChMatrix33<double> *R;
  element_type *peVar1;
  ChVectorDynamic<> displ;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_f0;
  ChMatrixDynamic<> FiR_local;
  ChVectorDynamic<> FiK_local;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_c0;
  double *local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_80;
  ChMatrixRef local_50;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0xc)
  {
    local_c0.m_lhs._0_4_ = 0xc;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&displ,(int *)&local_c0);
    (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[9])(this,&displ);
    local_c0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->StiffnessMatrix,
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiK_local,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_c0);
    R = &(this->super_ChElementCorotational).A;
    local_f0.m_matrix = &R->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_f0,
                      (ChVector<double> *)
                      &((((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->field_0x38);
    FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)&local_80;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,&displ,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_c0,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&FiR_local);
    local_f0.m_matrix = &R->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_f0,
                      (ChVector<double> *)
                      &((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->field_0x38);
    FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)&local_80;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,&displ,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_c0,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&FiR_local);
    local_f0.m_matrix = &R->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_f0,
                      (ChVector<double> *)
                      &((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->field_0x38);
    FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)&local_80;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,&displ,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_c0,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&FiR_local);
    local_f0.m_matrix = &R->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_f0,
                      (ChVector<double> *)
                      &((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->field_0x38);
    FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)&local_80;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,&displ,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_c0,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&FiR_local);
    local_f0.m_matrix =
         (non_const_type)
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    Eigen::operator*(&local_80,(double *)&local_f0,(StorageBaseType *)&this->StiffnessMatrix);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)&local_c0,&local_80,&displ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&FiR_local,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_c0);
    peVar1 = (this->Material).
             super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0.m_lhs =
         (LhsNested)
         (this->Volume * (peVar1->super_ChContinuumMaterial).density * 0.25 * peVar1->damping_M);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ,(Scalar *)&local_c0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&FiR_local,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiK_local,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&FiR_local);
    local_c0.m_lhs = (LhsNested)&DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&FiK_local,(Scalar *)&local_c0)
    ;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_c0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&FiK_local,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_50,
               &Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0);
    ChMatrixCorotation::ComputeCK((ChMatrixConstRef)&local_c0,R,4,&local_50);
    Eigen::internal::handmade_aligned_free(local_98);
    Eigen::internal::handmade_aligned_free
              (FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (FiK_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (displ.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    return;
  }
  __assert_fail("Fi.size() == 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                ,0xfa,
                "virtual void chrono::fea::ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);  // nodal displacements, local

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    displ.segment(0, 3) = (A.transpose() * nodes[0]->pos_dt).eigen();  // nodal speeds, local
    displ.segment(3, 3) = (A.transpose() * nodes[1]->pos_dt).eigen();
    displ.segment(6, 3) = (A.transpose() * nodes[2]->pos_dt).eigen();
    displ.segment(9, 3) = (A.transpose() * nodes[3]->pos_dt).eigen();
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / 4.0;
    displ *= lumped_node_mass * this->Material->Get_RayleighDampingM();
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);
}